

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stencil_strips.cpp
# Opt level: O0

void compute_coord(int num_dims,int *strip_sizes,int target_rank,int *coord,int *dim_order,
                  bool *flipped_dim)

{
  int iVar1;
  int iVar2;
  int rem_dim;
  int rem_dim_index;
  int strip_size;
  int coord_component;
  int dim_index;
  int curr_dim;
  bool *flipped_dim_local;
  int *dim_order_local;
  int *coord_local;
  int target_rank_local;
  int *strip_sizes_local;
  int num_dims_local;
  
  for (dim_index = 0; dim_index < num_dims; dim_index = dim_index + 1) {
    iVar1 = dim_order[dim_index];
    iVar2 = strip_sizes[iVar1];
    coord_component = target_rank;
    for (rem_dim_index = num_dims + -1; dim_index < rem_dim_index;
        rem_dim_index = rem_dim_index + -1) {
      coord_component = coord_component / strip_sizes[dim_order[rem_dim_index]];
    }
    if ((flipped_dim[iVar1] & 1U) == 0) {
      coord[iVar1] = coord_component % iVar2 + coord[iVar1];
    }
    else {
      coord[iVar1] = (iVar2 - (coord_component % iVar2 + 1)) + coord[iVar1];
    }
  }
  return;
}

Assistant:

void compute_coord(int num_dims, const int *strip_sizes, int target_rank, int *coord, const int *dim_order,
				   const bool *flipped_dim) {
  int curr_dim;
  for (int dim_index = 0; dim_index < num_dims; dim_index++) {
	curr_dim = dim_order[dim_index];
	int coord_component = target_rank;
	int strip_size = strip_sizes[curr_dim];

	for (int rem_dim_index = num_dims - 1; rem_dim_index > dim_index; rem_dim_index--) {
	  int rem_dim = dim_order[rem_dim_index];
	  coord_component /= strip_sizes[rem_dim];
	}

	if (flipped_dim[curr_dim]) {
	  coord[curr_dim] += strip_size - ((coord_component % strip_size) + 1);
	} else {
	  coord[curr_dim] += coord_component % strip_size;
	}
  }
}